

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_node_pos_cmp(void *item1,void *item2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  lyd_node_pos *np2;
  lyd_node_pos *np1;
  uint32_t mpos2;
  uint32_t mpos1;
  void *item2_local;
  void *item1_local;
  
  plVar3 = lys_node_module((lys_node *)**item1);
  plVar4 = lys_node_module((lys_node *)**item2);
  if (plVar3 == plVar4) {
    if (*(uint *)((long)item2 + 8) < *(uint *)((long)item1 + 8)) {
      item1_local._4_4_ = 1;
    }
    else if (*(uint *)((long)item1 + 8) < *(uint *)((long)item2 + 8)) {
      item1_local._4_4_ = -1;
    }
    else {
      item1_local._4_4_ = 0;
    }
  }
  else {
    plVar3 = lys_node_module((lys_node *)**item1);
    uVar1 = lys_module_pos(plVar3);
    plVar3 = lys_node_module((lys_node *)**item2);
    uVar2 = lys_module_pos(plVar3);
    if (uVar2 < uVar1) {
      item1_local._4_4_ = 1;
    }
    else {
      item1_local._4_4_ = -1;
    }
  }
  return item1_local._4_4_;
}

Assistant:

static int
lyd_node_pos_cmp(const void *item1, const void *item2)
{
    uint32_t mpos1, mpos2;
    struct lyd_node_pos *np1, *np2;

    np1 = (struct lyd_node_pos *)item1;
    np2 = (struct lyd_node_pos *)item2;

    /* different modules? */
    if (lys_node_module(np1->node->schema) != lys_node_module(np2->node->schema)) {
        mpos1 = lys_module_pos(lys_node_module(np1->node->schema));
        mpos2 = lys_module_pos(lys_node_module(np2->node->schema));
        /* if lys_module_pos failed, there is nothing we can do anyway,
         * at least internal error will be printed */

        if (mpos1 > mpos2) {
            return 1;
        } else {
            return -1;
        }
    }

    if (np1->pos > np2->pos) {
        return 1;
    } else if (np1->pos < np2->pos) {
        return -1;
    }
    return 0;
}